

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::ClearDepthStencilImage
          (VulkanCommandBuffer *this,VkImage Image,VkClearDepthStencilValue *DepthStencil,
          VkImageSubresourceRange *Subresource)

{
  string msg;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",(char (*) [32])Subresource);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"ClearDepthStencilImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x4b);
    std::__cxx11::string::~string((string *)&msg);
  }
  if (((this->m_State).RenderPass != (VkRenderPass)0x0) ||
     ((this->m_State).DynamicRenderingHash != 0)) {
    Diligent::FormatString<char[180]>
              (&msg,(char (*) [180])
                    "vkCmdClearDepthStencilImage() must be called outside of render pass (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-renderpass)"
              );
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"ClearDepthStencilImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x4e);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((Subresource->aspectMask & 6) == 0 || (Subresource->aspectMask & 0xfffffff9) != 0) {
    Diligent::FormatString<char[240]>
              (&msg,(char (*) [240])
                    "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_DEPTH_BIT or VK_IMAGE_ASPECT_STENCIL_BIT (https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-aspectMask-02824)"
              );
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"ClearDepthStencilImage",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x53);
    std::__cxx11::string::~string((string *)&msg);
  }
  FlushBarriers(this);
  (*vkCmdClearDepthStencilImage)
            (this->m_VkCmdBuffer,Image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,DepthStencil,1,
             Subresource);
  return;
}

Assistant:

__forceinline void ClearDepthStencilImage(VkImage                         Image,
                                              const VkClearDepthStencilValue& DepthStencil,
                                              const VkImageSubresourceRange&  Subresource)
    {
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        VERIFY(!IsInRenderScope(),
               "vkCmdClearDepthStencilImage() must be called outside of render pass "
               "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-renderpass)");
        // clang-format off
        VERIFY((Subresource.aspectMask &  (VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT)) != 0 &&
               (Subresource.aspectMask & ~(VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT)) == 0,
               "The aspectMask of all image subresource ranges must only include VK_IMAGE_ASPECT_DEPTH_BIT or VK_IMAGE_ASPECT_STENCIL_BIT "
                "(https://registry.khronos.org/vulkan/specs/latest/html/vkspec.html#VUID-vkCmdClearDepthStencilImage-aspectMask-02824)");
        // clang-format on

        FlushBarriers();
        vkCmdClearDepthStencilImage(
            m_VkCmdBuffer,
            Image,
            VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, // must be VK_IMAGE_LAYOUT_GENERAL or VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL
            &DepthStencil,
            1,
            &Subresource);
    }